

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O0

Variable<double> * yyml::nn::MM<double>(Variable<double> *va,Variable<double> *vb)

{
  value_type vVar1;
  initializer_list<unsigned_long> dims;
  TensorShape *pTVar2;
  const_reference pvVar3;
  Variable<double> *pVVar4;
  Variable<double> *result;
  value_type local_70;
  Variable<double> **local_68;
  undefined8 local_60;
  undefined1 local_58 [8];
  TensorShape shape;
  size_t p;
  size_t n;
  size_t m;
  Variable<double> *vb_local;
  Variable<double> *va_local;
  
  pTVar2 = Tensor<double>::shape(&va->values_);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&pTVar2->dims,0);
  pVVar4 = (Variable<double> *)*pvVar3;
  pTVar2 = Tensor<double>::shape(&vb->values_);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&pTVar2->dims,1);
  vVar1 = *pvVar3;
  pTVar2 = Tensor<double>::shape(&va->values_);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&pTVar2->dims,1);
  shape.dims.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)*pvVar3;
  local_68 = &result;
  local_60 = 2;
  dims._M_len = 2;
  dims._M_array = (iterator)local_68;
  result = pVVar4;
  local_70 = vVar1;
  TensorShape::TensorShape((TensorShape *)local_58,dims);
  pVVar4 = Factory<yyml::nn::Variable<double>>::GetNewInstance<yyml::TensorShape&>
                     ((TensorShape *)local_58);
  MM<double>(va,vb,pVVar4);
  TensorShape::~TensorShape((TensorShape *)local_58);
  return pVVar4;
}

Assistant:

Variable<Type>* MM(Variable<Type>* va, Variable<Type>* vb) {
  size_t m = va->values_.shape().dims[0], n = vb->values_.shape().dims[1],
         p = va->values_.shape().dims[1];
  TensorShape shape = {m, n};
  auto* result = Variable<Type>::factory::GetNewInstance(shape);
  MM(va, vb, result);
  return result;
}